

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.cpp
# Opt level: O1

void __thiscall
LiteScript::_Type_CALLBACK::Save
          (_Type_CALLBACK *this,ostream *stream,Object *object,offset_in_Memory_to_subr caller)

{
  Callback *this_00;
  bool bVar1;
  long lVar2;
  OStreamer *this_01;
  Object *pOVar3;
  offset_in_Memory_to_subr in_R8;
  long *plVar4;
  Namer *pNVar5;
  OStreamer streamer;
  char local_46 [6];
  OStreamer local_40;
  Namer *local_38;
  
  this_00 = (Callback *)object->data;
  local_40.stream = stream;
  local_38 = (Namer *)caller;
  bVar1 = Callback::isInternal(this_00);
  if (bVar1) {
    local_46[0] = '\0';
    std::__ostream_insert<char,std::char_traits<char>>(local_40.stream,local_46,1);
    this_01 = &local_40;
    lVar2 = 0xa8;
  }
  else {
    local_46[1] = 1;
    std::__ostream_insert<char,std::char_traits<char>>(local_40.stream,local_46 + 1,1);
    this_01 = OStreamer::operator<<(&local_40,this_00->I);
    lVar2 = 0xa0;
  }
  OStreamer::operator<<
            (this_01,*(uint **)((long)&((Callback *)(&this_00->This + -1))->intrl_idx + lVar2));
  if (*(this_00->This).isNull == true) {
    local_46[2] = 0;
    std::__ostream_insert<char,std::char_traits<char>>(local_40.stream,local_46 + 2,1);
  }
  else {
    local_46[3] = 1;
    std::__ostream_insert<char,std::char_traits<char>>(local_40.stream,local_46 + 3,1);
    plVar4 = (long *)((long)(object->memory->arr)._M_elems + in_R8);
    pNVar5 = local_38;
    if (((ulong)local_38 & 1) != 0) {
      pNVar5 = *(Namer **)((local_38->current).data + *plVar4 + -0x11);
    }
    pOVar3 = Variable::operator->((Variable *)&this_00->This);
    (*(code *)pNVar5)(plVar4,stream,pOVar3->ID);
  }
  if (*(this_00->nsp).isNull == true) {
    local_46[4] = 0;
    std::__ostream_insert<char,std::char_traits<char>>(local_40.stream,local_46 + 4,1);
  }
  else {
    local_46[5] = 1;
    std::__ostream_insert<char,std::char_traits<char>>(local_40.stream,local_46 + 5,1);
    Namer::Save((Namer *)stream,(ostream *)&this_00->nsp,local_38,in_R8);
  }
  return;
}

Assistant:

void LiteScript::_Type_CALLBACK::Save(std::ostream &stream, Object &object, bool (Memory::*caller)(std::ostream&, unsigned int)) const {
    Callback& C = object.GetData<Callback>();
    OStreamer streamer(stream);
    if (C.isInternal())
        streamer << (unsigned char)0 << C.CallbackIndex;
    else
        streamer << (unsigned char)1 << C.I << C.L;
    if (C.This.isNull)
        streamer << (unsigned char)0;
    else {
        streamer << (unsigned char) 1;
        (object.memory.*caller)(stream, (*C.This)->ID);
    }
    if (C.nsp.isNull)
        streamer << (unsigned char)0;
    else {
        streamer << (unsigned char) 1;
        Namer::Save(stream, *C.nsp, caller);
    }
}